

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

matches * atombf_a(iasctx *ctx,void *v,int spos)

{
  easm_expr *peVar1;
  ull num;
  uint64_t uVar2;
  int iVar3;
  match *pmVar4;
  matches *rres;
  uint64_t b;
  uint64_t a;
  easm_expr *expr;
  match res;
  bitfield *bf;
  int spos_local;
  void *v_local;
  iasctx *ctx_local;
  
  if ((spos == ctx->atomsnum) || (ctx->atoms[spos]->type != LITEM_EXPR)) {
    ctx_local = (iasctx *)0x0;
  }
  else {
    res._176_8_ = v;
    memset(&expr,0,0xb8);
    res.m[1]._0_4_ = spos + 1;
    peVar1 = ctx->atoms[spos]->expr;
    if ((peVar1->type == EASM_EXPR_VEC) &&
       ((peVar1->e1->type == EASM_EXPR_NUM && (peVar1->e2->type == EASM_EXPR_NUM)))) {
      num = peVar1->e1->num;
      uVar2 = peVar1->e2->num;
      iVar3 = setbf((match *)&expr,(bitfield *)res._176_8_,num);
      if (iVar3 == 0) {
        ctx_local = (iasctx *)0x0;
      }
      else {
        iVar3 = setbf((match *)&expr,(bitfield *)(res._176_8_ + 0x30),uVar2 - num);
        if (iVar3 == 0) {
          ctx_local = (iasctx *)0x0;
        }
        else {
          ctx_local = (iasctx *)emptymatches();
          if (*(int *)((long)&ctx_local->varinfo + 4) <= *(int *)&ctx_local->varinfo) {
            if (*(int *)((long)&ctx_local->varinfo + 4) == 0) {
              *(int *)((long)&ctx_local->varinfo + 4) = 0x10;
            }
            else {
              *(int *)((long)&ctx_local->varinfo + 4) = *(int *)((long)&ctx_local->varinfo + 4) << 1
              ;
            }
            pmVar4 = (match *)realloc((match *)ctx_local->isa,
                                      (long)*(int *)((long)&ctx_local->varinfo + 4) * 0xb8);
            ctx_local->isa = (disisa *)pmVar4;
          }
          iVar3 = *(int *)&ctx_local->varinfo;
          *(int *)&ctx_local->varinfo = iVar3 + 1;
          memcpy((match *)ctx_local->isa + iVar3,&expr,0xb8);
        }
      }
    }
    else {
      ctx_local = (iasctx *)0x0;
    }
  }
  return (matches *)ctx_local;
}

Assistant:

struct matches *atombf_a APROTO {
	const struct bitfield *bf = v;
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct match res = { 0, .lpos = spos+1 };
	const struct easm_expr *expr = ctx->atoms[spos]->expr;
	if (expr->type != EASM_EXPR_VEC || expr->e1->type != EASM_EXPR_NUM || expr->e2->type != EASM_EXPR_NUM)
		return 0;
	uint64_t a = expr->e1->num;
	uint64_t b = expr->e2->num - a;
	if (!setbf(&res, &bf[0], a))
		return 0;
	if (!setbf(&res, &bf[1], b))
		return 0;
	struct matches *rres = emptymatches();
	ADDARRAY(rres->m, res);
	return rres;
}